

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O0

Matrix33<float> * __thiscall
Imath_3_2::Matrix33<float>::operator-(Matrix33<float> *this,Matrix33<float> *v)

{
  float *in_RDX;
  float *in_RSI;
  Matrix33<float> *in_RDI;
  
  Matrix33(in_RDI,*in_RSI - *in_RDX,in_RSI[1] - in_RDX[1],in_RSI[2] - in_RDX[2],
           in_RSI[3] - in_RDX[3],in_RSI[4] - in_RDX[4],in_RSI[5] - in_RDX[5],in_RSI[6] - in_RDX[6],
           in_RSI[7] - in_RDX[7],in_RSI[8] - in_RDX[8]);
  return in_RDI;
}

Assistant:

IMATH_HOSTDEVICE constexpr inline Matrix33<T>
Matrix33<T>::operator- (const Matrix33<T>& v) const IMATH_NOEXCEPT
{
    return Matrix33 (
        x[0][0] - v.x[0][0],
        x[0][1] - v.x[0][1],
        x[0][2] - v.x[0][2],
        x[1][0] - v.x[1][0],
        x[1][1] - v.x[1][1],
        x[1][2] - v.x[1][2],
        x[2][0] - v.x[2][0],
        x[2][1] - v.x[2][1],
        x[2][2] - v.x[2][2]);
}